

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

bool __thiscall mjs::object::delete_property(object *this,wstring_view *name)

{
  bool bVar1;
  property *elem;
  bool bVar2;
  pair<mjs::object::property_*,_mjs::gc_vector<mjs::object::property>_*> pVar3;
  
  pVar3 = find(this,*name);
  elem = pVar3.first;
  bVar2 = true;
  if (elem != (property *)0x0) {
    bVar1 = has_attributes(elem->attributes_,dont_delete);
    if (bVar1) {
      bVar2 = false;
    }
    else {
      gc_vector<mjs::object::property>::erase(pVar3.second,elem);
    }
  }
  return bVar2;
}

Assistant:

bool object::delete_property(const std::wstring_view& name) {
    auto [it, props] = find(name);
    if (!it) {
        return true;

    }
    if (has_attributes(it->attributes(), property_attribute::dont_delete)) {
        return false;
    }
    props->erase(it);
    return true;
}